

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::SnailAllocPages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  undefined4 *puVar7;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *node;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar8;
  PageSegmentBase<Memory::VirtualAllocWrapper> *decommitSegment;
  PageSegmentBase<Memory::VirtualAllocWrapper> *emptySegment;
  EditingIterator iter;
  PageSegmentBase<Memory::VirtualAllocWrapper> *newSegment;
  char *pages;
  PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment_local;
  uint pageCount_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  uVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x577,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iter.super_Iterator.current = (NodeBase *)0x0;
  bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Empty
                    (&this->emptySegments);
  if (!bVar3) {
    iter.super_Iterator.current =
         (NodeBase *)
         DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                   (&this->emptySegments);
    pcVar6 = SegmentBase<Memory::VirtualAllocWrapper>::GetAddress
                       ((SegmentBase<Memory::VirtualAllocWrapper> *)iter.super_Iterator.current);
    bVar3 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsAllocationPageAligned
                      (pcVar6,(ulong)pageCount,(uint *)0x0);
    if (!bVar3) {
      iter.super_Iterator.current = (NodeBase *)0x0;
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
      EditingIterator((EditingIterator *)&emptySegment,&this->emptySegments);
      do {
        if (iter.super_Iterator.list ==
            (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pPVar8 = emptySegment;
        node = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                         (&(iter.super_Iterator.list)->
                           super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                         );
        bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                          ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>
                            *)pPVar8,node);
        if (bVar3) {
          iter.super_Iterator.list =
               (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
          goto LAB_009908f9;
        }
        iter.super_Iterator.list =
             (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
             DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                       (&(iter.super_Iterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>)
        ;
        pPVar8 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
                 Iterator::Data((Iterator *)&emptySegment);
        pcVar6 = SegmentBase<Memory::VirtualAllocWrapper>::GetAddress
                           (&pPVar8->super_SegmentBase<Memory::VirtualAllocWrapper>);
        bVar3 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsAllocationPageAligned
                          (pcVar6,(ulong)pageCount,(uint *)0x0);
      } while (!bVar3);
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
      MoveCurrentTo((EditingIterator *)&emptySegment,&this->emptySegments);
      iter.super_Iterator.current = (NodeBase *)pPVar8;
    }
LAB_009908f9:
    if ((iter.super_Iterator.current != (NodeBase *)0x0) &&
       (pcVar6 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
                           ((PageSegmentBase<Memory::VirtualAllocWrapper> *)
                            iter.super_Iterator.current,pageCount), pcVar6 != (char *)0x0)) {
      OnAllocFromNewSegment
                (this,pageCount,pcVar6,
                 (SegmentBase<Memory::VirtualAllocWrapper> *)iter.super_Iterator.current);
      *pageSegment = (PageSegmentBase<Memory::VirtualAllocWrapper> *)iter.super_Iterator.current;
      return pcVar6;
    }
  }
  this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                *)TryAllocDecommittedPages<false>(this,pageCount,pageSegment);
  if (this_local ==
      (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
       *)0x0) {
    if (this->maxAllocPageCount < pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x5a9,"(maxAllocPageCount >= pageCount)","maxAllocPageCount >= pageCount")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((this->maxAllocPageCount == pageCount) ||
       ((ulong)(this->maxAllocPageCount - pageCount) + this->freePageCount <=
        (ulong)this->maxFreePageCount)) {
      iter.super_Iterator.current = (NodeBase *)AddPageSegment(this,&this->emptySegments);
      if ((PageSegmentBase<Memory::VirtualAllocWrapper> *)iter.super_Iterator.current ==
          (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
        this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                      *)0x0;
      }
      else {
        this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                      *)PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
                                  ((PageSegmentBase<Memory::VirtualAllocWrapper> *)
                                   iter.super_Iterator.current,pageCount);
        if (this_local !=
            (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             *)0x0) {
          OnAllocFromNewSegment
                    (this,pageCount,this_local,
                     (SegmentBase<Memory::VirtualAllocWrapper> *)iter.super_Iterator.current);
          *pageSegment = (PageSegmentBase<Memory::VirtualAllocWrapper> *)iter.super_Iterator.current
          ;
        }
      }
    }
    else {
      pPVar8 = AllocPageSegment(&this->decommitSegments,this,false,false,
                                (bool)(this->enableWriteBarrier & 1));
      if (pPVar8 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
        this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                      *)0x0;
      }
      else {
        this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                      *)PageSegmentBase<Memory::VirtualAllocWrapper>::DoAllocDecommitPages<false>
                                  (pPVar8,pageCount);
        if (this_local !=
            (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             *)0x0) {
          sVar1 = this->decommitPageCount;
          uVar5 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetDecommitPageCount(pPVar8);
          this->decommitPageCount = sVar1 + uVar5;
          FillAllocPages(this,this_local,pageCount);
          LogRecommitPages(this,(ulong)pageCount);
          LogAllocPages(this,(ulong)pageCount);
          *pageSegment = pPVar8;
        }
      }
    }
  }
  else {
    FillAllocPages(this,this_local,pageCount);
  }
  return (char *)this_local;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SnailAllocPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    char * pages = nullptr;
    TPageSegment * newSegment = nullptr;

    if (!emptySegments.Empty())
    {
        newSegment = &emptySegments.Head();

        if (!notPageAligned && !TPageSegment::IsAllocationPageAligned(newSegment->GetAddress(), pageCount))
        {
            newSegment = nullptr;

            // Scan through the empty segments for a segment that can fit this allocation
            FOREACH_DLISTBASE_ENTRY_EDITING(TPageSegment, emptySegment, &this->emptySegments, iter)
            {
                if (TPageSegment::IsAllocationPageAligned(emptySegment.GetAddress(), pageCount))
                {
                    iter.MoveCurrentTo(&this->emptySegments);
                    newSegment = &emptySegment;
                    break;
                }
            }
            NEXT_DLISTBASE_ENTRY_EDITING
        }

        if (newSegment != nullptr)
        {
            pages = newSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                OnAllocFromNewSegment(pageCount, pages, newSegment);
                *pageSegment = newSegment;
                return pages;
            }
        }
    }

    pages = TryAllocDecommittedPages<notPageAligned>(pageCount, pageSegment);
    if (pages != nullptr)
    {
        // TryAllocDecommittedPages may give out a mix of free pages and decommitted pages.
        // Free pages are filled with 0xFE in debug build, so we need to zero them
        // out before giving it out. In release build, free page is already zeroed
        // in ReleasePages
        this->FillAllocPages(pages, pageCount);
        return pages;
    }

    Assert(pages == nullptr);
    Assert(maxAllocPageCount >= pageCount);
    if (maxAllocPageCount != pageCount && (maxFreePageCount < maxAllocPageCount - pageCount + freePageCount))
    {
        // If we exceed the number of max free page count, allocate from a new fully decommit block
        TPageSegment * decommitSegment = AllocPageSegment(
            this->decommitSegments, this, false, false, this->enableWriteBarrier);
        if (decommitSegment == nullptr)
        {
            return nullptr;
        }

        pages = decommitSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount + decommitSegment->GetDecommitPageCount();
#endif
            this->FillAllocPages(pages, pageCount);

            LogRecommitPages(pageCount);
            LogAllocPages(pageCount);

            *pageSegment = decommitSegment;
        }
        return pages;
    }

    // At this point, we haven't been able to allocate either from the
    // decommitted pages, or from the empty segment list, so we'll
    // try allocating a segment. In a page allocator with a pre-reserved segment,
    // we're not allowed to allocate additional segments so return here.
    // Otherwise, add a new segment and allocate from it

    newSegment = AddPageSegment(emptySegments);
    if (newSegment == nullptr)
    {
        return nullptr;
    }

    pages = newSegment->template AllocPages<notPageAligned>(pageCount);
    if (notPageAligned)
    {
        // REVIEW: Is this true for single-chunk allocations too? Are new segments guaranteed to
        // allow for single-chunk allocations to succeed?
        Assert(pages != nullptr);
    }

    if (pages != nullptr)
    {
        OnAllocFromNewSegment(pageCount, pages, newSegment);
        *pageSegment = newSegment;
    }

    return pages;
}